

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O3

void __thiscall
cab_manager::add_request(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  shared_ptr<cab> cab;
  char local_31;
  cab *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  find_cab((cab_manager *)&stack0xffffffffffffffd0,(node_type)this,src,
           (uint32_t)CONCAT71(in_register_00000011,dst));
  if (local_30 == (cab *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"found no cab for request ",0x19);
    poVar1 = ::operator<<((ostream *)&std::cout,src);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," --> ",5);
    poVar1 = ::operator<<(poVar1,dst);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"found cab with id ",0x12);
    ::cab::id(local_30);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," for request ",0xd);
    poVar1 = ::operator<<(poVar1,src);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," --> ",5);
    poVar1 = ::operator<<(poVar1,dst);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
    ::cab::add_request(local_30,src,dst,passengers);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void cab_manager::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    std::shared_ptr<cab> cab = find_cab(src, dst, passengers);
    if(cab == nullptr)
    {
        std::cout << "found no cab for request " << src << " --> " << dst << '\n';
        return;
    }

    std::cout << "found cab with id " << cab->id() << " for request " << src << " --> " << dst << '\n';
    cab->add_request(src, dst, passengers);
}